

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

cmLinkImplementationLibraries * __thiscall
cmGeneratorTarget::GetLinkImplementationLibrariesInternal
          (cmGeneratorTarget *this,string *config,cmGeneratorTarget *head,LinkInterfaceFor implFor)

{
  _Base_ptr p_Var1;
  bool bVar2;
  map<const_cmGeneratorTarget_*,_cmOptionalLinkImplementation,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkImplementation>_>_>
  *this_00;
  cmLinkImplementationLibraries *impl;
  cmGeneratorTarget *local_28;
  
  local_28 = head;
  bVar2 = cmTarget::CanCompileSources(this->Target);
  if (bVar2) {
    if (implFor == Usage) {
      this_00 = &GetHeadToLinkImplementationUsageRequirementsMap(this,config)->
                 super_map<const_cmGeneratorTarget_*,_cmOptionalLinkImplementation,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkImplementation>_>_>
      ;
    }
    else {
      this_00 = &GetHeadToLinkImplementationMap(this,config)->
                 super_map<const_cmGeneratorTarget_*,_cmOptionalLinkImplementation,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkImplementation>_>_>
      ;
    }
    if (((this_00->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) &&
       (p_Var1 = (this_00->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
       *(char *)((long)&p_Var1[6]._M_parent + 3) == '\0')) {
      local_28 = *(cmGeneratorTarget **)(p_Var1 + 1);
    }
    impl = (cmLinkImplementationLibraries *)
           std::
           map<const_cmGeneratorTarget_*,_cmOptionalLinkImplementation,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkImplementation>_>_>
           ::operator[](this_00,&local_28);
    if (*(char *)((long)&impl[2].Libraries.
                         super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl
                         .super__Vector_impl_data._M_start + 1) == '\0') {
      *(undefined1 *)
       ((long)&impl[2].Libraries.super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>
               ._M_impl.super__Vector_impl_data._M_start + 1) = 1;
      ComputeLinkImplementationLibraries
                (this,config,(cmOptionalLinkImplementation *)impl,local_28,implFor);
    }
  }
  else {
    impl = (cmLinkImplementationLibraries *)0x0;
  }
  return impl;
}

Assistant:

cmLinkImplementationLibraries const*
cmGeneratorTarget::GetLinkImplementationLibrariesInternal(
  const std::string& config, cmGeneratorTarget const* head,
  LinkInterfaceFor implFor) const
{
  // There is no link implementation for targets that cannot compile sources.
  if (!this->CanCompileSources()) {
    return nullptr;
  }

  // Populate the link implementation libraries for this configuration.
  HeadToLinkImplementationMap& hm =
    (implFor == LinkInterfaceFor::Usage
       ? this->GetHeadToLinkImplementationUsageRequirementsMap(config)
       : this->GetHeadToLinkImplementationMap(config));

  // If the link implementation does not depend on the head target
  // then re-use the one from the head we computed first.
  if (!hm.empty() && !hm.begin()->second.HadHeadSensitiveCondition) {
    head = hm.begin()->first;
  }

  cmOptionalLinkImplementation& impl = hm[head];
  if (!impl.LibrariesDone) {
    impl.LibrariesDone = true;
    this->ComputeLinkImplementationLibraries(config, impl, head, implFor);
  }
  return &impl;
}